

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

upb_Arena * upb_Arena_Init(void *mem,size_t n,upb_alloc *alloc)

{
  ulong uVar1;
  upb_Arena *puVar2;
  char *pcVar3;
  ulong uVar4;
  
  if (n == 0) {
    uVar1 = 0;
  }
  else {
    pcVar3 = (char *)((long)mem + 7U & 0xfffffffffffffff8);
    uVar4 = (long)pcVar3 - (long)mem;
    uVar1 = 0;
    if (uVar4 <= n) {
      uVar1 = n - uVar4;
    }
    uVar1 = uVar1 & 0xfffffffffffffff8;
    mem = pcVar3;
  }
  if (0x37 < uVar1) {
    pcVar3 = (char *)((long)mem + (uVar1 - 0x20));
    pcVar3[0] = '\x03';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    pcVar3 = (char *)((long)mem + (uVar1 - 0x18));
    pcVar3[0] = '\0';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    *(char **)((long)mem + (uVar1 - 0x10)) = (char *)((long)mem + (uVar1 - 0x28));
    pcVar3 = (char *)((long)mem + (uVar1 - 8));
    pcVar3[0] = '\0';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    if (((ulong)alloc & 1) == 0) {
      puVar2 = (upb_Arena *)((long)mem + (uVar1 - 0x38));
      *(ulong *)((long)mem + (uVar1 - 0x28)) = (ulong)alloc | 1;
      puVar2->ptr_dont_copy_me__upb_internal_use_only = (char *)mem;
      *(upb_Arena **)((long)mem + (uVar1 - 0x30)) = puVar2;
      return puVar2;
    }
    __assert_fail("(alloc_uint & 1) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/mem/arena.c"
                  ,0x78,"uintptr_t _upb_Arena_MakeBlockAlloc(upb_alloc *, _Bool)");
  }
  puVar2 = _upb_Arena_InitSlow(alloc);
  return puVar2;
}

Assistant:

upb_Arena* upb_Arena_Init(void* mem, size_t n, upb_alloc* alloc) {
  UPB_ASSERT(sizeof(void*) * UPB_ARENA_SIZE_HACK >= sizeof(upb_ArenaState));
  upb_ArenaState* a;

  if (n) {
    /* Align initial pointer up so that we return properly-aligned pointers. */
    void* aligned = (void*)UPB_ALIGN_UP((uintptr_t)mem, UPB_MALLOC_ALIGN);
    size_t delta = (uintptr_t)aligned - (uintptr_t)mem;
    n = delta <= n ? n - delta : 0;
    mem = aligned;
  }

  /* Round block size down to alignof(*a) since we will allocate the arena
   * itself at the end. */
  n = UPB_ALIGN_DOWN(n, UPB_ALIGN_OF(upb_ArenaState));

  if (UPB_UNLIKELY(n < sizeof(upb_ArenaState))) {
#ifdef UPB_TRACING_ENABLED
    upb_Arena* ret = _upb_Arena_InitSlow(alloc);
    upb_Arena_LogInit(ret, n);
    return ret;
#else
    return _upb_Arena_InitSlow(alloc);
#endif
  }

  a = UPB_PTR_AT(mem, n - sizeof(upb_ArenaState), upb_ArenaState);

  upb_Atomic_Init(&a->body.parent_or_count, _upb_Arena_TaggedFromRefcount(1));
  upb_Atomic_Init(&a->body.next, NULL);
  upb_Atomic_Init(&a->body.tail, &a->body);
  upb_Atomic_Init(&a->body.blocks, NULL);

  a->body.block_alloc = _upb_Arena_MakeBlockAlloc(alloc, 1);
  a->head.UPB_PRIVATE(ptr) = mem;
  a->head.UPB_PRIVATE(end) = UPB_PTR_AT(mem, n - sizeof(upb_ArenaState), char);
#ifdef UPB_TRACING_ENABLED
  upb_Arena_LogInit(&a->head, n);
#endif
  return &a->head;
}